

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genbrk.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  FILE *pFVar2;
  UBool UVar3;
  int32_t textLength;
  int iVar4;
  uint32_t uVar5;
  char *pcVar6;
  UConverter *cnv;
  char *pcVar7;
  ulong uVar8;
  RuleBasedBreakIterator *this;
  undefined4 extraout_var;
  UNewDataMemory *pData_00;
  size_t size;
  FILE *pFVar9;
  RuleBasedBreakIterator *local_198;
  UNewDataMemory *pData;
  size_t bytesWritten;
  uint8_t *outData;
  uint32_t outDataSize;
  RuleBasedBreakIterator *local_138;
  RuleBasedBreakIterator *bi;
  uint local_128;
  UParseError parseError;
  ConstChar16Ptr local_d8;
  undefined1 local_d0 [8];
  UnicodeString ruleSourceS;
  UChar *ruleSourceU;
  uint32_t destCap;
  UConverter *conv;
  char *encoding;
  char *ruleSourceC;
  char *pcStack_60;
  int32_t signatureLength;
  char *ruleBufferC;
  FILE *file;
  long ruleFileSize;
  long result;
  char *copyright;
  char *outDir;
  char *outFileName;
  char *ruleFileName;
  char **ppcStack_18;
  UErrorCode status;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ruleFileName._4_4_ = 0;
  copyright = (char *)0x0;
  result = 0;
  progName = *argv;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  argv_local._0_4_ = u_parseArgs(argc,argv,9,options);
  if ((int)argv_local < 0) {
    fprintf(_stderr,"error in command line argument \"%s\"\n",ppcStack_18[-(int)argv_local]);
    usageAndDie(1);
  }
  if ((options[0].doesOccur != '\0') || (options[1].doesOccur != '\0')) {
    usageAndDie(0);
  }
  if ((options[3].doesOccur == '\0') || (options[4].doesOccur == '\0')) {
    fprintf(_stderr,"rule file and output file must both be specified.\n");
    usageAndDie(1);
  }
  outFileName = options[3].value;
  outDir = options[4].value;
  if (options[5].doesOccur != '\0') {
    u_setDataDirectory_63(options[5].value);
  }
  ruleFileName._4_4_ = U_ZERO_ERROR;
  if (options[6].doesOccur != '\0') {
    copyright = options[6].value;
  }
  if (options[7].doesOccur != '\0') {
    result = (long)anon_var_dwarf_178;
  }
  u_init_63((UErrorCode *)((long)&ruleFileName + 4));
  UVar3 = U_FAILURE(ruleFileName._4_4_);
  pFVar2 = _stderr;
  if (UVar3 != '\0') {
    pcVar7 = *ppcStack_18;
    pcVar6 = u_errorName_63(ruleFileName._4_4_);
    fprintf(pFVar2,"%s: can not initialize ICU.  status = %s\n",pcVar7,pcVar6);
    exit(1);
  }
  ruleFileName._4_4_ = U_ZERO_ERROR;
  ruleBufferC = (char *)fopen(outFileName,"rb");
  if ((FILE *)ruleBufferC == (FILE *)0x0) {
    fprintf(_stderr,"Could not open file \"%s\"\n",outFileName);
    exit(-1);
  }
  fseek((FILE *)ruleBufferC,0,2);
  file = (FILE *)ftell((FILE *)ruleBufferC);
  fseek((FILE *)ruleBufferC,0,0);
  pFVar9 = file + 10;
  if ((long)pFVar9 < 0) {
    pFVar9 = (FILE *)0xffffffffffffffff;
  }
  pcStack_60 = (char *)operator_new__((ulong)pFVar9);
  ruleFileSize = fread(pcStack_60,1,(size_t)file,(FILE *)ruleBufferC);
  if ((FILE *)ruleFileSize != file) {
    fprintf(_stderr,"Error reading file \"%s\"\n",outFileName);
    exit(-1);
  }
  pcStack_60[(long)file] = '\0';
  fclose((FILE *)ruleBufferC);
  pcVar7 = pcStack_60;
  encoding = pcStack_60;
  pcVar6 = ucnv_detectUnicodeSignature_63
                     (pcStack_60,(int32_t)file,(int32_t *)((long)&ruleSourceC + 4),
                      (UErrorCode *)((long)&ruleFileName + 4));
  UVar3 = U_FAILURE(ruleFileName._4_4_);
  if (UVar3 != '\0') {
    exit(ruleFileName._4_4_);
  }
  if (pcVar6 != (char *)0x0) {
    encoding = pcVar7 + ruleSourceC._4_4_;
    file = file + -(long)ruleSourceC._4_4_;
  }
  cnv = ucnv_open_63(pcVar6,(UErrorCode *)((long)&ruleFileName + 4));
  UVar3 = U_FAILURE(ruleFileName._4_4_);
  pFVar2 = _stderr;
  if (UVar3 != '\0') {
    pcVar7 = u_errorName_63(ruleFileName._4_4_);
    fprintf(pFVar2,"ucnv_open: ICU Error \"%s\"\n",pcVar7);
    exit(ruleFileName._4_4_);
  }
  textLength = ucnv_toUChars_63(cnv,(UChar *)0x0,0,encoding,(int32_t)file,
                                (UErrorCode *)((long)&ruleFileName + 4));
  pFVar2 = _stderr;
  if (ruleFileName._4_4_ != U_BUFFER_OVERFLOW_ERROR) {
    pcVar7 = u_errorName_63(ruleFileName._4_4_);
    fprintf(pFVar2,"ucnv_toUChars: ICU Error \"%s\"\n",pcVar7);
    exit(ruleFileName._4_4_);
  }
  ruleFileName._4_4_ = U_ZERO_ERROR;
  auVar1 = ZEXT416(textLength + 1) * ZEXT816(2);
  uVar8 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  ruleSourceS.fUnion._48_8_ = operator_new__(uVar8);
  ucnv_toUChars_63(cnv,(UChar *)ruleSourceS.fUnion._48_8_,textLength + 1,encoding,(int32_t)file,
                   (UErrorCode *)((long)&ruleFileName + 4));
  UVar3 = U_FAILURE(ruleFileName._4_4_);
  pFVar2 = _stderr;
  if (UVar3 != '\0') {
    pcVar7 = u_errorName_63(ruleFileName._4_4_);
    fprintf(pFVar2,"ucnv_toUChars: ICU Error \"%s\"\n",pcVar7);
    exit(ruleFileName._4_4_);
  }
  ucnv_close_63(cnv);
  icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_d8,(char16_t *)ruleSourceS.fUnion._48_8_);
  size = 0;
  icu_63::UnicodeString::UnicodeString((UnicodeString *)local_d0,'\0',&local_d8,textLength);
  icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_d8);
  bi._4_4_ = 0;
  local_128 = 0;
  this = (RuleBasedBreakIterator *)icu_63::UMemory::operator_new((UMemory *)0x280,size);
  outData._7_1_ = 0;
  local_198 = (RuleBasedBreakIterator *)0x0;
  if (this != (RuleBasedBreakIterator *)0x0) {
    outData._7_1_ = 1;
    _outDataSize = this;
    icu_63::RuleBasedBreakIterator::RuleBasedBreakIterator
              (this,(UnicodeString *)local_d0,(UParseError *)((long)&bi + 4),
               (UErrorCode *)((long)&ruleFileName + 4));
    local_198 = this;
  }
  local_138 = local_198;
  UVar3 = U_FAILURE(ruleFileName._4_4_);
  pFVar2 = _stderr;
  if (UVar3 != '\0') {
    pcVar7 = u_errorName_63(ruleFileName._4_4_);
    fprintf(pFVar2,"createRuleBasedBreakIterator: ICU Error \"%s\"  at line %d, column %d\n",pcVar7,
            (ulong)bi._4_4_,(ulong)local_128);
    exit(ruleFileName._4_4_);
  }
  iVar4 = (*(local_138->super_BreakIterator).super_UObject._vptr_UObject[0x19])(local_138,&outData);
  dh.info.formatVersion = *(uint8_t (*) [4])((long)CONCAT44(extraout_var,iVar4) + 4);
  pData_00 = udata_create(copyright,(char *)0x0,outDir,&dh.info,(char *)result,
                          (UErrorCode *)((long)&ruleFileName + 4));
  UVar3 = U_FAILURE(ruleFileName._4_4_);
  pcVar7 = outDir;
  pFVar2 = _stderr;
  if (UVar3 != '\0') {
    pcVar6 = u_errorName_63(ruleFileName._4_4_);
    fprintf(pFVar2,"genbrk: Could not open output file \"%s\", \"%s\"\n",pcVar7,pcVar6);
    exit(ruleFileName._4_4_);
  }
  udata_writeBlock(pData_00,(void *)CONCAT44(extraout_var,iVar4),(uint32_t)outData);
  uVar5 = udata_finish(pData_00,(UErrorCode *)((long)&ruleFileName + 4));
  UVar3 = U_FAILURE(ruleFileName._4_4_);
  if (UVar3 != '\0') {
    fprintf(_stderr,"genbrk: error %d writing the output file\n",(ulong)(uint)ruleFileName._4_4_);
    exit(ruleFileName._4_4_);
  }
  if (uVar5 != (uint32_t)outData) {
    fprintf(_stderr,"Error writing to output file \"%s\"\n",outDir);
    exit(-1);
  }
  if (local_138 != (RuleBasedBreakIterator *)0x0) {
    (*(local_138->super_BreakIterator).super_UObject._vptr_UObject[1])();
  }
  if (ruleSourceS.fUnion._48_8_ != 0) {
    operator_delete__((void *)ruleSourceS.fUnion._48_8_);
  }
  if (pcStack_60 != (char *)0x0) {
    operator_delete__(pcStack_60);
  }
  u_cleanup_63();
  if (options[8].doesOccur == '\0') {
    printf("genbrk: tool completed successfully.\n");
  }
  argv_local._4_4_ = 0;
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_d0);
  return argv_local._4_4_;
}

Assistant:

int  main(int argc, char **argv) {
    UErrorCode  status = U_ZERO_ERROR;
    const char *ruleFileName;
    const char *outFileName;
    const char *outDir = NULL;
    const char *copyright = NULL;

    //
    // Pick up and check the command line arguments,
    //    using the standard ICU tool utils option handling.
    //
    U_MAIN_INIT_ARGS(argc, argv);
    progName = argv[0];
    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);
    if(argc<0) {
        // Unrecognized option
        fprintf(stderr, "error in command line argument \"%s\"\n", argv[-argc]);
        usageAndDie(U_ILLEGAL_ARGUMENT_ERROR);
    }

    if(options[0].doesOccur || options[1].doesOccur) {
        //  -? or -h for help.
        usageAndDie(0);
    }

    if (!(options[3].doesOccur && options[4].doesOccur)) {
        fprintf(stderr, "rule file and output file must both be specified.\n");
        usageAndDie(U_ILLEGAL_ARGUMENT_ERROR);
    }
    ruleFileName = options[3].value;
    outFileName  = options[4].value;

    if (options[5].doesOccur) {
        u_setDataDirectory(options[5].value);
    }

    status = U_ZERO_ERROR;

    /* Combine the directory with the file name */
    if(options[6].doesOccur) {
        outDir = options[6].value;
    }
    if (options[7].doesOccur) {
        copyright = U_COPYRIGHT_STRING;
    }

#if UCONFIG_NO_BREAK_ITERATION || UCONFIG_NO_FILE_IO

    UNewDataMemory *pData;
    char msg[1024];

    /* write message with just the name */
    sprintf(msg, "genbrk writes dummy %s because of UCONFIG_NO_BREAK_ITERATION and/or UCONFIG_NO_FILE_IO, see uconfig.h", outFileName);
    fprintf(stderr, "%s\n", msg);

    /* write the dummy data file */
    pData = udata_create(outDir, NULL, outFileName, &dummyDataInfo, NULL, &status);
    udata_writeBlock(pData, msg, strlen(msg));
    udata_finish(pData, &status);
    return (int)status;

#else
    /* Initialize ICU */
    u_init(&status);
    if (U_FAILURE(status)) {
        fprintf(stderr, "%s: can not initialize ICU.  status = %s\n",
            argv[0], u_errorName(status));
        exit(1);
    }
    status = U_ZERO_ERROR;

    //
    //  Read in the rule source file
    //
    long        result;
    long        ruleFileSize;
    FILE        *file;
    char        *ruleBufferC;

    file = fopen(ruleFileName, "rb");
    if( file == 0 ) {
        fprintf(stderr, "Could not open file \"%s\"\n", ruleFileName);
        exit(-1);
    }
    fseek(file, 0, SEEK_END);
    ruleFileSize = ftell(file);
    fseek(file, 0, SEEK_SET);
    ruleBufferC = new char[ruleFileSize+10];

    result = (long)fread(ruleBufferC, 1, ruleFileSize, file);
    if (result != ruleFileSize)  {
        fprintf(stderr, "Error reading file \"%s\"\n", ruleFileName);
        exit (-1);
    }
    ruleBufferC[ruleFileSize]=0;
    fclose(file);

    //
    // Look for a Unicode Signature (BOM) on the rule file
    //
    int32_t        signatureLength;
    const char *   ruleSourceC = ruleBufferC;
    const char*    encoding = ucnv_detectUnicodeSignature(
                           ruleSourceC, ruleFileSize, &signatureLength, &status);
    if (U_FAILURE(status)) {
        exit(status);
    }
    if(encoding!=NULL ){
        ruleSourceC  += signatureLength;
        ruleFileSize -= signatureLength;
    }

    //
    // Open a converter to take the rule file to UTF-16
    //
    UConverter* conv;
    conv = ucnv_open(encoding, &status);
    if (U_FAILURE(status)) {
        fprintf(stderr, "ucnv_open: ICU Error \"%s\"\n", u_errorName(status));
        exit(status);
    }

    //
    // Convert the rules to UChar.
    //  Preflight first to determine required buffer size.
    //
    uint32_t destCap = ucnv_toUChars(conv,
                       NULL,           //  dest,
                       0,              //  destCapacity,
                       ruleSourceC,
                       ruleFileSize,
                       &status);
    if (status != U_BUFFER_OVERFLOW_ERROR) {
        fprintf(stderr, "ucnv_toUChars: ICU Error \"%s\"\n", u_errorName(status));
        exit(status);
    };

    status = U_ZERO_ERROR;
    UChar *ruleSourceU = new UChar[destCap+1];
    ucnv_toUChars(conv,
                  ruleSourceU,     //  dest,
                  destCap+1,
                  ruleSourceC,
                  ruleFileSize,
                  &status);
    if (U_FAILURE(status)) {
        fprintf(stderr, "ucnv_toUChars: ICU Error \"%s\"\n", u_errorName(status));
        exit(status);
    };
    ucnv_close(conv);


    //
    //  Put the source rules into a UnicodeString
    //
    UnicodeString ruleSourceS(FALSE, ruleSourceU, destCap);

    //
    //  Create the break iterator from the rules
    //     This will compile the rules.
    //
    UParseError parseError;
    parseError.line = 0;
    parseError.offset = 0;
    RuleBasedBreakIterator *bi = new RuleBasedBreakIterator(ruleSourceS, parseError, status);
    if (U_FAILURE(status)) {
        fprintf(stderr, "createRuleBasedBreakIterator: ICU Error \"%s\"  at line %d, column %d\n",
                u_errorName(status), (int)parseError.line, (int)parseError.offset);
        exit(status);
    };


    //
    //  Get the compiled rule data from the break iterator.
    //
    uint32_t        outDataSize;
    const uint8_t  *outData;
    outData = bi->getBinaryRules(outDataSize);

    // Copy the data format version numbers from the RBBI data header into the UDataMemory header.
    uprv_memcpy(dh.info.formatVersion, ((RBBIDataHeader *)outData)->fFormatVersion, sizeof(dh.info.formatVersion));

    //
    //  Create the output file
    //
    size_t bytesWritten;
    UNewDataMemory *pData;
    pData = udata_create(outDir, NULL, outFileName, &(dh.info), copyright, &status);
    if(U_FAILURE(status)) {
        fprintf(stderr, "genbrk: Could not open output file \"%s\", \"%s\"\n", 
                         outFileName, u_errorName(status));
        exit(status);
    }


    //  Write the data itself.
    udata_writeBlock(pData, outData, outDataSize);
    // finish up 
    bytesWritten = udata_finish(pData, &status);
    if(U_FAILURE(status)) {
        fprintf(stderr, "genbrk: error %d writing the output file\n", status);
        exit(status);
    }
    
    if (bytesWritten != outDataSize) {
        fprintf(stderr, "Error writing to output file \"%s\"\n", outFileName);
        exit(-1);
    }

    delete bi;
    delete[] ruleSourceU;
    delete[] ruleBufferC;
    u_cleanup();


    if(!options[8].doesOccur) {
        printf("genbrk: tool completed successfully.\n");
    }
    return 0;

#endif /* #if !UCONFIG_NO_BREAK_ITERATION */
}